

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O3

bool __thiscall FTraceInfo::TraceTraverse(FTraceInfo *this,int ptflags)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  extsector_t *peVar5;
  F3DFloor **ppFVar6;
  F3DFloor *pFVar7;
  secplane_t *psVar8;
  AActor *pAVar9;
  vertex_t *pvVar10;
  FTraceResults *pFVar11;
  double dVar12;
  double dVar13;
  bool bVar14;
  intercept_t *in;
  long lVar15;
  sector_t *psVar16;
  int iVar17;
  FTraceResults *res;
  FTraceResults *pFVar18;
  ulong uVar19;
  double dist;
  double dVar20;
  double dVar21;
  double dVar22;
  FPathTraverse it;
  FTraceResults hsecResult;
  DVector3 local_178;
  DVector3 local_158;
  FPathTraverse local_140;
  FTraceResults local_100;
  
  Setup3DFloors(this);
  local_140._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_00872258;
  FPathTraverse::init(&local_140,(EVP_PKEY_CTX *)(ulong)(ptflags | 8));
  iVar17 = -1;
LAB_00578b73:
  do {
    in = FPathTraverse::Next(&local_140);
    if (in == (intercept_t *)0x0) break;
    if (this->Results->Crossed3DWater == (F3DFloor *)0x0) {
      iVar3 = this->CurSector->sectornum;
      if (iVar17 != iVar3) {
        peVar5 = this->CurSector->e;
        uVar19 = (ulong)(peVar5->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        iVar17 = iVar3;
        if (uVar19 != 0) {
          ppFVar6 = (peVar5->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
          lVar15 = 0;
          do {
            pFVar7 = *(F3DFloor **)((long)ppFVar6 + lVar15);
            if ((~pFVar7->flags & 0x11) == 0) {
              bVar14 = CheckPlane(this,(pFVar7->top).plane);
              if (bVar14) {
                psVar8 = (pFVar7->top).plane;
                pFVar18 = this->Results;
                psVar16 = this->CurSector;
                dVar21 = (pFVar18->HitPos).X;
                dVar22 = (pFVar18->HitPos).Y;
                if ((psVar16->floorplane).negiC *
                    ((psVar16->floorplane).normal.Y * dVar22 +
                    (psVar16->floorplane).normal.X * dVar21 + (psVar16->floorplane).D) <
                    psVar8->negiC *
                    ((psVar8->normal).Y * dVar22 + (psVar8->normal).X * dVar21 + psVar8->D)) {
                  pFVar18->Crossed3DWater = pFVar7;
                  (pFVar18->Crossed3DWaterPos).Z = (pFVar18->HitPos).Z;
                  (pFVar18->Crossed3DWaterPos).X = dVar21;
                  (pFVar18->Crossed3DWaterPos).Y = dVar22;
                  pFVar18->Distance = 0.0;
                }
              }
            }
            lVar15 = lVar15 + 8;
          } while (uVar19 << 3 != lVar15);
          iVar17 = this->CurSector->sectornum;
        }
      }
    }
    dVar21 = this->MaxDist;
    dist = in->frac * dVar21;
    dVar22 = (this->Vec).Z;
    dVar12 = (this->Start).X;
    dVar13 = (this->Start).Y;
    dVar1 = (this->Start).Z;
    dVar20 = dist * dVar22 + dVar1;
    if ((0.0 <= dVar22) || (psVar16 = this->CurSector, (psVar16->planes[0].Flags & 0x1d0U) != 0x100)
       ) {
      if ((0.0 < dVar22) &&
         (((psVar16 = this->CurSector, (psVar16->planes[1].Flags & 0x1d0U) == 0x100 &&
           (dVar2 = sectorPortals.Array[psVar16->Portals[1]].mPlaneZ, dVar2 < dVar20)) &&
          (this->limitz <= dVar2 && dVar2 != this->limitz)))) {
        this->limitz = dVar2;
        EnterSectorPortal(this,&local_140,1,(dVar2 - dVar1) / (dVar21 * dVar22),psVar16);
        goto LAB_00578b73;
      }
    }
    else {
      dVar2 = sectorPortals.Array[psVar16->Portals[0]].mPlaneZ;
      if ((dVar20 < dVar2) && (dVar2 < this->limitz)) {
        this->limitz = dVar2;
        EnterSectorPortal(this,&local_140,0,(dVar2 - dVar1) / (dVar21 * dVar22),psVar16);
        goto LAB_00578b73;
      }
    }
    dVar21 = (this->Vec).X * dist + dVar12;
    dVar22 = (this->Vec).Y * dist + dVar13;
    pAVar9 = (AActor *)(in->d).line;
    if (in->isaline == true) {
      uVar4 = *(uint *)&(pAVar9->Angles).Yaw.Degrees;
      if (((((uVar4 < linePortals.Count) && ((linePortals.Array[uVar4].mFlags & 2) != 0)) &&
           (pvVar10 = (vertex_t *)(pAVar9->super_DThinker).super_DObject._vptr_DObject,
           (double)(pAVar9->super_DThinker).super_DObject.GCNext * ((pvVar10->p).X - dVar12) +
           ((DVector2 *)&(pAVar9->super_DThinker).super_DObject.ObjNext)->X *
           (dVar13 - (pvVar10->p).Y) <= 1.52587890625e-05)) &&
          ((psVar16 = (sector_t *)(pAVar9->SpriteRotation).Degrees, psVar16 == (sector_t *)0x0 ||
           ((((psVar16->floorplane).normal.Y * dVar22 +
             (psVar16->floorplane).D + (psVar16->floorplane).normal.X * dVar21) *
             (psVar16->floorplane).negiC <= dVar20 &&
            (dVar20 <= ((psVar16->ceilingplane).normal.Y * dVar22 +
                       (psVar16->ceilingplane).D + (psVar16->ceilingplane).normal.X * dVar21) *
                       (psVar16->ceilingplane).negiC)))))) &&
         ((linePortals.Array[uVar4].mType == '\x03' || ((this->TraceFlags & 8) == 0)))) {
        EnterLinePortal(this,&local_140,in);
        goto LAB_00578b73;
      }
      local_158.X = dVar21;
      local_158.Y = dVar22;
      local_158.Z = dVar20;
      bVar14 = LineCheck(this,in,dist,&local_158);
    }
    else {
      if ((((this->ActorMask).Value & (pAVar9->flags).Value) == 0) || (pAVar9 == this->IgnoreThis))
      goto LAB_00578b73;
      local_178.X = dVar21;
      local_178.Y = dVar22;
      local_178.Z = dVar20;
      bVar14 = ThingCheck(this,in,dist,&local_178);
    }
  } while (bVar14 != false);
  pFVar18 = this->Results;
  psVar16 = this->CurSector;
  if (pFVar18->HitType != TRACE_HitNone) goto LAB_00578fbf;
  if ((psVar16->planes[0].Flags & 0x1d0U) == 0x100) {
LAB_00578f7b:
    if ((psVar16->planes[1].Flags & 0x1d0U) == 0x100) {
      pFVar18 = this->Results;
      goto LAB_00578fbf;
    }
    bVar14 = CheckPlane(this,&psVar16->ceilingplane);
    pFVar18 = this->Results;
    psVar16 = this->CurSector;
    if (!bVar14) goto LAB_00578fbf;
    pFVar18->HitType = TRACE_HitCeiling;
    iVar17 = psVar16->planes[1].Texture.texnum;
  }
  else {
    bVar14 = CheckPlane(this,&psVar16->floorplane);
    psVar16 = this->CurSector;
    if (!bVar14) goto LAB_00578f7b;
    pFVar18 = this->Results;
    pFVar18->HitType = TRACE_HitFloor;
    iVar17 = psVar16->planes[0].Texture.texnum;
  }
  (pFVar18->HitTexture).texnum = iVar17;
LAB_00578fbf:
  pFVar18->Sector = sectors + psVar16->sectornum;
  if ((pFVar18->CrossedWater == (sector_t *)0x0) &&
     (psVar16 = psVar16->heightsec, psVar16 != (sector_t *)0x0)) {
    dVar21 = (psVar16->floorplane).D;
    dVar1 = (psVar16->floorplane).normal.X;
    dVar12 = (psVar16->floorplane).normal.Y;
    dVar22 = (psVar16->floorplane).negiC;
    if ((((this->Start).Y * dVar12 + dVar21 + (this->Start).X * dVar1) * dVar22 < (this->Start).Z)
       && ((pFVar18->HitPos).Z <=
           dVar22 * (dVar12 * (pFVar18->HitPos).Y + dVar21 + dVar1 * (pFVar18->HitPos).X))) {
      this->Results = &local_100;
      bVar14 = CheckPlane(this,&psVar16->floorplane);
      if (bVar14) {
        pFVar11 = this->Results;
        pFVar11->CrossedWater = sectors + this->CurSector->sectornum;
        (pFVar11->CrossedWaterPos).Z = (pFVar11->HitPos).Z;
        dVar21 = (pFVar11->HitPos).Y;
        (pFVar11->CrossedWaterPos).X = (pFVar11->HitPos).X;
        (pFVar11->CrossedWaterPos).Y = dVar21;
        pFVar11->Distance = 0.0;
      }
      this->Results = pFVar18;
    }
  }
  bVar14 = true;
  if (pFVar18->HitType == TRACE_HitNone) {
    if ((pFVar18->Distance != 0.0) || (NAN(pFVar18->Distance))) {
      bVar14 = false;
    }
    else {
      dVar21 = this->MaxDist;
      dVar1 = (this->Vec).X;
      dVar22 = (this->Vec).Y;
      (pFVar18->HitPos).Z = (this->Vec).Z * dVar21 + (this->Start).Z;
      dVar12 = (this->Start).Y;
      (pFVar18->HitPos).X = (this->Start).X + dVar1 * dVar21;
      (pFVar18->HitPos).Y = dVar12 + dVar21 * dVar22;
      SetSourcePosition(this);
      pFVar18 = this->Results;
      pFVar18->Distance = this->MaxDist;
      pFVar18->Fraction = 1.0;
      bVar14 = pFVar18->HitType != TRACE_HitNone;
    }
  }
  FPathTraverse::~FPathTraverse(&local_140);
  return bVar14;
}

Assistant:

bool FTraceInfo::TraceTraverse (int ptflags)
{
	// Do a 3D floor check in the starting sector
	Setup3DFloors();

	FPathTraverse it(Start.X, Start.Y, Vec.X * MaxDist, Vec.Y * MaxDist, ptflags | PT_DELTA, startfrac);
	intercept_t *in;
	int lastsplashsector = -1;

	while ((in = it.Next()))
	{
		// Deal with splashes in 3D floors (but only run once per sector, not each iteration - and stop if something was found.)
		if (Results->Crossed3DWater == NULL && lastsplashsector != CurSector->sectornum)
		{
			for (auto rover : CurSector->e->XFloor.ffloors)
			{
				if ((rover->flags & FF_EXISTS) && (rover->flags&FF_SWIMMABLE))
				{
					if (Check3DFloorPlane(rover, false))
					{
						// only consider if the plane is above the actual floor.
						if (rover->top.plane->ZatPoint(Results->HitPos) > CurSector->floorplane.ZatPoint(Results->HitPos))
						{
							Results->Crossed3DWater = rover;
							Results->Crossed3DWaterPos = Results->HitPos;
							Results->Distance = 0;
						}
					}
				}
			}
			lastsplashsector = CurSector->sectornum;
		}

		double dist = MaxDist * in->frac;
		DVector3 hit = Start + Vec * dist;

		// Crossed a floor portal? 
		if (Vec.Z < 0 && !CurSector->PortalBlocksMovement(sector_t::floor))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::floor);
			if (hit.Z < portz && limitz > portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::floor, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}
		// ... or a ceiling portal?
		else if (Vec.Z > 0 && !CurSector->PortalBlocksMovement(sector_t::ceiling))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::ceiling);
			if (hit.Z > portz && limitz < portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::ceiling, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}

		if (in->isaline)
		{
			if (in->d.line->isLinePortal() && P_PointOnLineSidePrecise(Start, in->d.line) == 0)
			{
				sector_t *entersector = in->d.line->backsector;
				if (entersector == NULL || (hit.Z >= entersector->floorplane.ZatPoint(hit) && hit.Z <= entersector->ceilingplane.ZatPoint(hit)))
				{
					FLinePortal *port = in->d.line->getPortal();
					// The caller cannot handle portals without global offset.
					if (port->mType == PORTT_LINKED || !(TraceFlags & TRACE_PortalRestrict))
					{
						EnterLinePortal(it, in);
						continue;
					}
				}
			}
			if (!LineCheck(in, dist, hit)) break;
		}
		else if ((in->d.thing->flags & ActorMask) && in->d.thing != IgnoreThis)
		{
			if (!ThingCheck(in, dist, hit)) break;
		}
	}

	if (Results->HitType == TRACE_HitNone)
	{
		if (CurSector->PortalBlocksMovement(sector_t::floor) && CheckSectorPlane(CurSector, true))
		{
			Results->HitType = TRACE_HitFloor;
			Results->HitTexture = CurSector->GetTexture(sector_t::floor);
		}
		else if (CurSector->PortalBlocksMovement(sector_t::ceiling) && CheckSectorPlane(CurSector, false))
		{
			Results->HitType = TRACE_HitCeiling;
			Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
		}
	}

	// check for intersection with floor/ceiling
	Results->Sector = &sectors[CurSector->sectornum];

	if (Results->CrossedWater == NULL &&
		CurSector->heightsec != NULL &&
		CurSector->heightsec->floorplane.ZatPoint(Start) < Start.Z &&
		CurSector->heightsec->floorplane.ZatPoint(Results->HitPos) >= Results->HitPos.Z)
	{
		// Save the result so that the water check doesn't destroy it.
		FTraceResults *res = Results;
		FTraceResults hsecResult;
		Results = &hsecResult;

		if (CheckSectorPlane(CurSector->heightsec, true))
		{
			Results->CrossedWater = &sectors[CurSector->sectornum];
			Results->CrossedWaterPos = Results->HitPos;
			Results->Distance = 0;
		}
		Results = res;
	}
	if (Results->HitType == TRACE_HitNone && Results->Distance == 0)
	{
		Results->HitPos = Start + Vec * MaxDist;
		SetSourcePosition();
		Results->Distance = MaxDist;
		Results->Fraction = 1.;
	}
	return Results->HitType != TRACE_HitNone;
}